

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O3

void xmlFARegExecSave(xmlRegExecCtxtPtr exec)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  xmlRegExecRollback *pxVar4;
  int *__dest;
  int len;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  
  if (10000000 < exec->nbPush) {
    exec->status = -6;
    return;
  }
  exec->nbPush = exec->nbPush + 1;
  uVar1 = exec->maxRollbacks;
  iVar5 = exec->nbRollbacks;
  if (iVar5 < (int)uVar1) {
LAB_0017bc1b:
    pxVar4 = exec->rollbacks;
    pxVar4[iVar5].state = exec->state;
    pxVar4[iVar5].index = exec->index;
    pxVar4[iVar5].nextbranch = exec->transno + 1;
    iVar3 = exec->comp->nbCounters;
    if (0 < (long)iVar3) {
      __dest = pxVar4[iVar5].counts;
      if (__dest == (int *)0x0) {
        __dest = (int *)(*xmlMalloc)((long)iVar3 << 2);
        exec->rollbacks[exec->nbRollbacks].counts = __dest;
        if (__dest == (int *)0x0) goto LAB_0017bc9f;
        iVar3 = exec->comp->nbCounters;
      }
      memcpy(__dest,exec->counts,(long)iVar3 << 2);
      iVar5 = exec->nbRollbacks;
    }
    exec->nbRollbacks = iVar5 + 1;
  }
  else {
    if ((int)uVar1 < 1) {
      uVar7 = 4;
LAB_0017bbcf:
      pxVar4 = (xmlRegExecRollback *)(*xmlRealloc)(exec->rollbacks,uVar7 * 0x18);
      if (pxVar4 != (xmlRegExecRollback *)0x0) {
        exec->rollbacks = pxVar4;
        exec->maxRollbacks = (int)uVar7;
        memset(pxVar4 + iVar5,0,(long)((int)uVar7 - iVar5) * 0x18);
        iVar5 = exec->nbRollbacks;
        goto LAB_0017bc1b;
      }
    }
    else if (uVar1 < 1000000000) {
      uVar6 = uVar1 + 1 >> 1;
      uVar2 = uVar6 + uVar1;
      if (1000000000 - uVar6 < uVar1) {
        uVar2 = 1000000000;
      }
      uVar7 = (ulong)uVar2;
      goto LAB_0017bbcf;
    }
LAB_0017bc9f:
    exec->status = -5;
  }
  return;
}

Assistant:

static void
xmlFARegExecSave(xmlRegExecCtxtPtr exec) {
#ifdef MAX_PUSH
    if (exec->nbPush > MAX_PUSH) {
        exec->status = XML_REGEXP_INTERNAL_LIMIT;
        return;
    }
    exec->nbPush++;
#endif

    if (exec->nbRollbacks >= exec->maxRollbacks) {
	xmlRegExecRollback *tmp;
        int newSize;
	int len = exec->nbRollbacks;

        newSize = xmlGrowCapacity(exec->maxRollbacks, sizeof(tmp[0]),
                                  4, XML_MAX_ITEMS);
	if (newSize < 0) {
            exec->status = XML_REGEXP_OUT_OF_MEMORY;
	    return;
	}
	tmp = xmlRealloc(exec->rollbacks, newSize * sizeof(tmp[0]));
	if (tmp == NULL) {
            exec->status = XML_REGEXP_OUT_OF_MEMORY;
	    return;
	}
	exec->rollbacks = tmp;
	exec->maxRollbacks = newSize;
	tmp = &exec->rollbacks[len];
	memset(tmp, 0, (exec->maxRollbacks - len) * sizeof(xmlRegExecRollback));
    }
    exec->rollbacks[exec->nbRollbacks].state = exec->state;
    exec->rollbacks[exec->nbRollbacks].index = exec->index;
    exec->rollbacks[exec->nbRollbacks].nextbranch = exec->transno + 1;
    if (exec->comp->nbCounters > 0) {
	if (exec->rollbacks[exec->nbRollbacks].counts == NULL) {
	    exec->rollbacks[exec->nbRollbacks].counts = (int *)
		xmlMalloc(exec->comp->nbCounters * sizeof(int));
	    if (exec->rollbacks[exec->nbRollbacks].counts == NULL) {
		exec->status = XML_REGEXP_OUT_OF_MEMORY;
		return;
	    }
	}
	memcpy(exec->rollbacks[exec->nbRollbacks].counts, exec->counts,
	       exec->comp->nbCounters * sizeof(int));
    }
    exec->nbRollbacks++;
}